

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::PerformReconnections(CConnman *this)

{
  long lVar1;
  bool bVar2;
  Mutex *pszName;
  AnnotatedMixin<std::mutex> *in_RDI;
  __off64_t *__offout;
  size_t __len;
  long in_FS_OFFSET;
  ReconnectionInfo *item;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> todo;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock106;
  uint in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
  *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  CSemaphoreGrant *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  reference in_stack_ffffffffffffff88;
  int local_70;
  int in_stack_ffffffffffffffb8;
  ConnectionType in_stack_ffffffffffffffbc;
  iterator in_stack_ffffffffffffffc0;
  CSemaphoreGrant *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd7;
  CAddress *in_stack_ffffffffffffffd8;
  CConnman *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             (Mutex *)0x21792a);
  AssertLockNotHeldInline
            (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
             (Mutex *)0x21794e);
  do {
    std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
    list((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)
         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    pszName = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48));
    __offout = (__off64_t *)0xf4e;
    __len = 0;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff88,in_RDI,
               (char *)pszName,(char *)in_stack_ffffffffffffff70,
               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
    bVar2 = std::__cxx11::
            list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::empty
                      ((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (bVar2) {
      local_70 = 3;
    }
    else {
      in_stack_ffffffffffffffc0 =
           std::__cxx11::
           list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::end
                     (in_stack_ffffffffffffff50);
      std::_List_const_iterator<CConnman::ReconnectionInfo>::_List_const_iterator
                ((_List_const_iterator<CConnman::ReconnectionInfo> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),(iterator *)0x217a0a)
      ;
      in_stack_ffffffffffffff70 =
           &in_RDI[0x1c].super_mutex.super___mutex_base._M_mutex.__data.__owner;
      std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
      begin(in_stack_ffffffffffffff50);
      std::_List_const_iterator<CConnman::ReconnectionInfo>::_List_const_iterator
                ((_List_const_iterator<CConnman::ReconnectionInfo> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),(iterator *)0x217a3d)
      ;
      std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
      splice((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)
             &stack0xffffffffffffffd0,(int)in_stack_ffffffffffffffc8,
             (__off64_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffffb8,__offout,__len,
             in_stack_ffffffffffffff48);
      local_70 = 0;
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (local_70 == 0) {
      std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
      begin(in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff88 =
           std::_List_iterator<CConnman::ReconnectionInfo>::operator*
                     ((_List_iterator<CConnman::ReconnectionInfo> *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      in_stack_ffffffffffffff68 = &in_stack_ffffffffffffff88->grant;
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (!bVar2) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      in_stack_ffffffffffffff48 = in_stack_ffffffffffffff88->use_v2transport & 1;
      OpenNetworkConnection
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7
                 ,in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0._M_node,
                 in_stack_ffffffffffffffbc,SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
      local_70 = 0;
    }
    std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
    ~list((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)
          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  } while (local_70 == 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::PerformReconnections()
{
    AssertLockNotHeld(m_reconnections_mutex);
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    while (true) {
        // Move first element of m_reconnections to todo (avoiding an allocation inside the lock).
        decltype(m_reconnections) todo;
        {
            LOCK(m_reconnections_mutex);
            if (m_reconnections.empty()) break;
            todo.splice(todo.end(), m_reconnections, m_reconnections.begin());
        }

        auto& item = *todo.begin();
        OpenNetworkConnection(item.addr_connect,
                              // We only reconnect if the first attempt to connect succeeded at
                              // connection time, but then failed after the CNode object was
                              // created. Since we already know connecting is possible, do not
                              // count failure to reconnect.
                              /*fCountFailure=*/false,
                              std::move(item.grant),
                              item.destination.empty() ? nullptr : item.destination.c_str(),
                              item.conn_type,
                              item.use_v2transport);
    }
}